

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void slang::ast::InstanceSymbol::fromFixupSyntax
               (Compilation *comp,DefinitionSymbol *definition,DataDeclarationSyntax *syntax,
               ASTContext *context,SmallVectorBase<const_slang::ast::Symbol_*> *results)

{
  Token *this;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar1;
  undefined1 auVar2 [16];
  int iVar3;
  DeclaratorSyntax *pDVar4;
  SourceLocation SVar5;
  Diagnostic *this_00;
  HierarchicalInstanceSyntax *pHVar6;
  ulong uVar7;
  undefined4 extraout_var;
  HierarchyInstantiationSyntax *syntax_00;
  ParentList *pPVar8;
  string_view sVar9;
  const_iterator __begin2;
  Token local_128;
  SmallVectorBase<const_slang::ast::Symbol_*> *local_118;
  ulong local_110;
  DefinitionSymbol *local_108;
  InstanceNameSyntax *instName;
  SmallVector<const_slang::ast::Symbol_*,_5UL> implicitNets;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> local_b8;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> instances;
  
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  pSVar1 = &syntax->declarators;
  __begin2.index = 0;
  __begin2.list = pSVar1;
  instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  local_110 = (syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1;
  uVar7 = 0;
  pPVar8 = pSVar1;
  local_118 = results;
  local_108 = definition;
  while ((pPVar8 != pSVar1 || (uVar7 != local_110))) {
    pDVar4 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<const_slang::syntax::DeclaratorSyntax_*>::dereference(&__begin2);
    this = &pDVar4->name;
    sVar9 = parsing::Token::valueText(this);
    if (sVar9._M_len != 0) {
      SVar5 = parsing::Token::location(this);
      if (instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len != 0) {
        implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ =
             parsing::Token::createMissing(&comp->super_BumpAllocator,Comma,SVar5);
        implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap =
             implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap & 0xffffffffffffff00
        ;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                   (TokenOrSyntax *)&implicitNets);
      }
      sVar9 = parsing::Token::rawText(this);
      SVar5 = (SourceLocation)(sVar9._M_len * 0x10000000 + (long)SVar5);
      this_00 = ASTContext::addDiag(context,(DiagCode)0x4d0006,SVar5);
      sVar9 = DefinitionSymbol::getKindString(local_108);
      Diagnostic::operator<<(this_00,sVar9);
      instName = BumpAllocator::
                 emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token_const&,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>const&>
                           (&comp->super_BumpAllocator,this,&pDVar4->dimensions);
      implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ =
           parsing::Token::createMissing(&comp->super_BumpAllocator,OpenParenthesis,SVar5);
      local_b8._M_ptr = (pointer)0x0;
      local_b8._M_extent._M_extent_value = 0;
      local_128 = parsing::Token::createMissing(&comp->super_BumpAllocator,CloseParenthesis,SVar5);
      pHVar6 = BumpAllocator::
               emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::InstanceNameSyntax*&,slang::parsing::Token,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token>
                         (&comp->super_BumpAllocator,&instName,(Token *)&implicitNets,&local_b8,
                          &local_128);
      implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ = (pointer)pHVar6;
      implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap =
           CONCAT71(implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                 (TokenOrSyntax *)&implicitNets);
    }
    uVar7 = __begin2.index + 1;
    __begin2.index = uVar7;
    pPVar8 = __begin2.list;
  }
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>._0_16_ = ZEXT816(0);
  __begin2 = (const_iterator)
             slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)(syntax->type).ptr);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_128.info;
  local_128 = (Token)(auVar2 << 0x40);
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)__begin2.index);
  local_b8._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
  syntax_00 = BumpAllocator::
              emplace<slang::syntax::HierarchyInstantiationSyntax,std::span<slang::syntax::AttributeInstanceSyntax*,18446744073709551615ul>,slang::parsing::Token,decltype(nullptr),std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token_const&>
                        (&comp->super_BumpAllocator,
                         (span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *)
                         &implicitNets,(Token *)&__begin2,(void **)&local_128,&local_b8,
                         &syntax->semi);
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.len = 0;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.data_ =
       (pointer)implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.firstElement;
  implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>.cap = 5;
  fromSyntax(comp,syntax_00,context,local_118,
             &implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>,
             (BindDirectiveInfo *)0x0,(SyntaxNode *)0x0);
  SmallVectorBase<const_slang::ast::Symbol_*>::cleanup
            (&implicitNets.super_SmallVectorBase<const_slang::ast::Symbol_*>,
             (EVP_PKEY_CTX *)syntax_00);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&instances.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
             (EVP_PKEY_CTX *)syntax_00);
  return;
}

Assistant:

void InstanceSymbol::fromFixupSyntax(Compilation& comp, const DefinitionSymbol& definition,
                                     const DataDeclarationSyntax& syntax, const ASTContext& context,
                                     SmallVectorBase<const Symbol*>& results) {
    auto missing = [&](TokenKind tk, SourceLocation loc) {
        return Token::createMissing(comp, tk, loc);
    };

    // Fabricate a fake instantiation syntax to let us reuse all of the real logic
    // for this fixup case.
    SmallVector<TokenOrSyntax, 4> instances;
    for (auto decl : syntax.declarators) {
        if (decl->name.valueText().empty())
            continue;

        auto loc = decl->name.location();
        if (!instances.empty())
            instances.push_back(missing(TokenKind::Comma, loc));

        loc = loc + decl->name.rawText().length();
        context.addDiag(diag::InstanceMissingParens, loc) << definition.getKindString();

        auto instName = comp.emplace<InstanceNameSyntax>(decl->name, decl->dimensions);
        auto instance = comp.emplace<HierarchicalInstanceSyntax>(
            instName, missing(TokenKind::OpenParenthesis, loc), std::span<TokenOrSyntax>(),
            missing(TokenKind::CloseParenthesis, loc));

        instances.push_back(instance);
    }

    auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
        std::span<AttributeInstanceSyntax*>(), syntax.type->getFirstToken(), nullptr,
        instances.copy(comp), syntax.semi);

    SmallVector<const Symbol*> implicitNets;
    fromSyntax(comp, *instantiation, context, results, implicitNets);
    SLANG_ASSERT(implicitNets.empty());
}